

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::VersionSet
          (VersionSet *this,string *dbname,Options *options,TableCache *table_cache,
          InternalKeyComparator *cmp)

{
  Version *this_00;
  string *local_68;
  InternalKeyComparator *cmp_local;
  TableCache *table_cache_local;
  Options *options_local;
  string *dbname_local;
  VersionSet *this_local;
  
  this->env_ = options->env;
  std::__cxx11::string::string((string *)&this->dbname_,(string *)dbname);
  this->options_ = options;
  this->table_cache_ = table_cache;
  InternalKeyComparator::InternalKeyComparator(&this->icmp_,cmp);
  this->next_file_number_ = 2;
  this->manifest_file_number_ = 0;
  this->last_sequence_ = 0;
  this->log_number_ = 0;
  this->prev_log_number_ = 0;
  this->descriptor_file_ = (WritableFile *)0x0;
  this->descriptor_log_ = (Writer *)0x0;
  Version::Version(&this->dummy_versions_,this);
  this->current_ = (Version *)0x0;
  local_68 = (string *)&this->field_0x170;
  do {
    std::__cxx11::string::string(local_68);
    local_68 = local_68 + 0x20;
  } while ((VersionSet *)local_68 != this + 1);
  this_00 = (Version *)operator_new(0xe8);
  Version::Version(this_00,this);
  AppendVersion(this,this_00);
  return;
}

Assistant:

VersionSet::VersionSet(const std::string& dbname, const Options* options,
                       TableCache* table_cache,
                       const InternalKeyComparator* cmp)
    : env_(options->env),
      dbname_(dbname),
      options_(options),
      table_cache_(table_cache),
      icmp_(*cmp),
      next_file_number_(2),
      manifest_file_number_(0),  // Filled by Recover()
      last_sequence_(0),
      log_number_(0),
      prev_log_number_(0),
      descriptor_file_(nullptr),
      descriptor_log_(nullptr),
      dummy_versions_(this),
      current_(nullptr) {
  AppendVersion(new Version(this));
}